

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_t.cpp
# Opt level: O1

void __thiscall deci::stack_t::stack_t(stack_t *this,stack_t *move)

{
  int iVar1;
  value_t *pvVar2;
  undefined4 extraout_var;
  
  (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (move->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (move->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (move->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (move->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (move->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (move->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dictionary_t::dictionary_t(&this->context,&move->context);
  this->result = move->result;
  pvVar2 = nothing_t::Instance();
  iVar1 = (*pvVar2->_vptr_value_t[2])(pvVar2);
  move->result = (value_t *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

stack_t::stack_t(stack_t&& move)
    : storage(std::move(move.storage))
    , context(std::move(move.context)) 
    , result(move.result)
  {
      move.result = nothing_t::Instance().Copy();
  }